

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_cod.c
# Opt level: O3

int pnm_fmt(uint_fast16_t magic)

{
  if (magic - 0x5031 < 6) {
    return *(int *)(magic * 4 + 0x12bac4);
  }
  abort();
}

Assistant:

int pnm_fmt(uint_fast16_t magic)
{
	int fmt;
	switch (magic) {
	case PNM_MAGIC_TXTPBM:
	case PNM_MAGIC_TXTPGM:
	case PNM_MAGIC_TXTPPM:
		fmt = PNM_FMT_TXT;
		break;
	case PNM_MAGIC_BINPBM:
	case PNM_MAGIC_BINPGM:
	case PNM_MAGIC_BINPPM:
		fmt = PNM_FMT_BIN;
		break;
	default:
		/* This should not happen. */
		abort();
		break;
	}
	return fmt;
}